

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O3

void __thiscall
Outputs::Display::OpenGL::Rectangle::Rectangle
          (Rectangle *this,float x,float y,float width,float height)

{
  GLuint *pGVar1;
  int iVar2;
  GLint GVar3;
  ostream *poVar4;
  socklen_t __len;
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  *attribute_bindings;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  float buffer [8];
  undefined1 local_98 [8];
  float local_90;
  float local_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  string local_68;
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  local_48;
  
  iVar2 = (int)local_98;
  local_98 = (undefined1  [8])&local_88;
  local_78 = x;
  local_74 = y;
  local_70 = width;
  local_6c = height;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "#version 150\nin vec2 position;void main(void){gl_Position = vec4(position, 0.0, 1.0);}"
             ,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "#version 150\nuniform vec4 colour;out vec4 fragColour;void main(void){fragColour = colour;}"
             ,"");
  attribute_bindings = &local_48;
  local_48.
  super__Vector_base<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Shader::Shader(&this->pixel_shader_,(string *)local_98,&local_68,attribute_bindings);
  __len = (socklen_t)attribute_bindings;
  std::
  vector<Outputs::Display::OpenGL::Shader::AttributeBinding,_std::allocator<Outputs::Display::OpenGL::Shader::AttributeBinding>_>
  ::~vector(&local_48);
  __addr = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    uVar6 = local_68.field_2._M_allocated_capacity + 1;
    operator_delete(local_68._M_dataplus._M_p,uVar6);
    iVar2 = (int)uVar6;
    __addr = extraout_RDX_00;
  }
  if (local_98 != (undefined1  [8])&local_88) {
    uVar6 = CONCAT44(local_88._M_allocated_capacity._4_4_,local_88._M_allocated_capacity._0_4_) + 1;
    operator_delete((void *)local_98,uVar6);
    iVar2 = (int)uVar6;
    __addr = extraout_RDX_01;
  }
  this->drawing_vertex_array_ = 0;
  this->drawing_array_buffer_ = 0;
  Shader::bind(&this->pixel_shader_,iVar2,__addr,__len);
  glGenVertexArrays(1,&this->drawing_vertex_array_);
  iVar2 = glGetError();
  if (iVar2 == 0) {
    pGVar1 = &this->drawing_array_buffer_;
    glGenBuffers(1,pGVar1);
    iVar2 = glGetError();
    if (iVar2 == 0) {
      glBindVertexArray(this->drawing_vertex_array_);
      iVar2 = glGetError();
      if (iVar2 == 0) {
        glBindBuffer(0x8892,*pGVar1);
        iVar2 = glGetError();
        if (iVar2 == 0) {
          local_98 = (undefined1  [8])&local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"position","");
          GVar3 = Shader::get_attrib_location(&this->pixel_shader_,(string *)local_98);
          if (local_98 != (undefined1  [8])&local_88) {
            operator_delete((void *)local_98,
                            CONCAT44(local_88._M_allocated_capacity._4_4_,
                                     local_88._M_allocated_capacity._0_4_) + 1);
          }
          glEnableVertexAttribArray(GVar3);
          iVar2 = glGetError();
          if (iVar2 == 0) {
            glVertexAttribPointer(GVar3,2,0x1406,0,8,0);
            iVar2 = glGetError();
            if (iVar2 == 0) {
              local_98 = (undefined1  [8])&local_88;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"colour","");
              GVar3 = Shader::get_uniform_location(&this->pixel_shader_,(string *)local_98);
              this->colour_uniform_ = GVar3;
              if (local_98 != (undefined1  [8])&local_88) {
                operator_delete((void *)local_98,
                                CONCAT44(local_88._M_allocated_capacity._4_4_,
                                         local_88._M_allocated_capacity._0_4_) + 1);
              }
              local_98._4_4_ = local_74;
              local_98._0_4_ = local_78;
              local_90 = local_78;
              local_8c = local_6c + local_74;
              local_88._M_allocated_capacity._0_4_ = local_70 + local_78;
              local_88._M_allocated_capacity._4_4_ = local_74;
              local_88._8_4_ = local_88._M_allocated_capacity._0_4_;
              local_88._12_4_ = local_8c;
              glBindBuffer(0x8892,*pGVar1);
              iVar2 = glGetError();
              if (iVar2 != 0) {
                switch(iVar2) {
                case 0x500:
                  lVar5 = 0xf;
                  pcVar7 = "GL_INVALID_ENUM";
                  break;
                case 0x501:
                  lVar5 = 0x10;
                  pcVar7 = "GL_INVALID_VALUE";
                  break;
                case 0x502:
                  lVar5 = 0x14;
                  pcVar7 = "GL_INVALID_OPERATION";
                  break;
                default:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Error ",6);
                  std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                  goto LAB_003c66ed;
                case 0x505:
                  lVar5 = 0x10;
                  pcVar7 = "GL_OUT_OF_MEMORY";
                  break;
                case 0x506:
                  lVar5 = 0x20;
                  pcVar7 = "GL_INVALID_FRAMEBUFFER_OPERATION";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,lVar5);
LAB_003c66ed:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr," at line ",9);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x40);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                           ,0x70);
                std::endl<char,std::char_traits<char>>(poVar4);
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                              ,0x40,
                              "Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                             );
              }
              glBufferData(0x8892,0x20,local_98,0x88e4);
              iVar2 = glGetError();
              if (iVar2 == 0) {
                return;
              }
              switch(iVar2) {
              case 0x500:
                lVar5 = 0xf;
                pcVar7 = "GL_INVALID_ENUM";
                break;
              case 0x501:
                lVar5 = 0x10;
                pcVar7 = "GL_INVALID_VALUE";
                break;
              case 0x502:
                lVar5 = 0x14;
                pcVar7 = "GL_INVALID_OPERATION";
                break;
              default:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6)
                ;
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                goto LAB_003c67aa;
              case 0x505:
                lVar5 = 0x10;
                pcVar7 = "GL_OUT_OF_MEMORY";
                break;
              case 0x506:
                lVar5 = 0x20;
                pcVar7 = "GL_INVALID_FRAMEBUFFER_OPERATION";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5)
              ;
LAB_003c67aa:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," at line ",9);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x41);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                         ,0x70);
              std::endl<char,std::char_traits<char>>(poVar4);
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                            ,0x41,
                            "Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                           );
            }
            switch(iVar2) {
            case 0x500:
              lVar5 = 0xf;
              pcVar7 = "GL_INVALID_ENUM";
              break;
            case 0x501:
              lVar5 = 0x10;
              pcVar7 = "GL_INVALID_VALUE";
              break;
            case 0x502:
              lVar5 = 0x14;
              pcVar7 = "GL_INVALID_OPERATION";
              break;
            default:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
              std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              goto LAB_003c6630;
            case 0x505:
              lVar5 = 0x10;
              pcVar7 = "GL_OUT_OF_MEMORY";
              break;
            case 0x506:
              lVar5 = 0x20;
              pcVar7 = "GL_INVALID_FRAMEBUFFER_OPERATION";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
LAB_003c6630:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at line ",9);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x33);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                       ,0x70);
            std::endl<char,std::char_traits<char>>(poVar4);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                          ,0x33,
                          "Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                         );
          }
          switch(iVar2) {
          case 0x500:
            lVar5 = 0xf;
            pcVar7 = "GL_INVALID_ENUM";
            break;
          case 0x501:
            lVar5 = 0x10;
            pcVar7 = "GL_INVALID_VALUE";
            break;
          case 0x502:
            lVar5 = 0x14;
            pcVar7 = "GL_INVALID_OPERATION";
            break;
          default:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            goto LAB_003c6573;
          case 0x505:
            lVar5 = 0x10;
            pcVar7 = "GL_OUT_OF_MEMORY";
            break;
          case 0x506:
            lVar5 = 0x20;
            pcVar7 = "GL_INVALID_FRAMEBUFFER_OPERATION";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
LAB_003c6573:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at line ",9);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                     ,0x70);
          std::endl<char,std::char_traits<char>>(poVar4);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                        ,0x2b,
                        "Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                       );
        }
        switch(iVar2) {
        case 0x500:
          lVar5 = 0xf;
          pcVar7 = "GL_INVALID_ENUM";
          break;
        case 0x501:
          lVar5 = 0x10;
          pcVar7 = "GL_INVALID_VALUE";
          break;
        case 0x502:
          lVar5 = 0x14;
          pcVar7 = "GL_INVALID_OPERATION";
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          goto LAB_003c64b6;
        case 0x505:
          lVar5 = 0x10;
          pcVar7 = "GL_OUT_OF_MEMORY";
          break;
        case 0x506:
          lVar5 = 0x20;
          pcVar7 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
LAB_003c64b6:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at line ",9);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                   ,0x70);
        std::endl<char,std::char_traits<char>>(poVar4);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                      ,0x28,
                      "Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)");
      }
      switch(iVar2) {
      case 0x500:
        lVar5 = 0xf;
        pcVar7 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        lVar5 = 0x10;
        pcVar7 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        lVar5 = 0x14;
        pcVar7 = "GL_INVALID_OPERATION";
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        goto LAB_003c63f9;
      case 0x505:
        lVar5 = 0x10;
        pcVar7 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        lVar5 = 0x20;
        pcVar7 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
LAB_003c63f9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at line ",9);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                 ,0x70);
      std::endl<char,std::char_traits<char>>(poVar4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                    ,0x27,
                    "Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)");
    }
    switch(iVar2) {
    case 0x500:
      lVar5 = 0xf;
      pcVar7 = "GL_INVALID_ENUM";
      break;
    case 0x501:
      lVar5 = 0x10;
      pcVar7 = "GL_INVALID_VALUE";
      break;
    case 0x502:
      lVar5 = 0x14;
      pcVar7 = "GL_INVALID_OPERATION";
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      goto LAB_003c633c;
    case 0x505:
      lVar5 = 0x10;
      pcVar7 = "GL_OUT_OF_MEMORY";
      break;
    case 0x506:
      lVar5 = 0x20;
      pcVar7 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
LAB_003c633c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at line ",9);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
               ,0x70);
    std::endl<char,std::char_traits<char>>(poVar4);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                  ,0x25,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)"
                 );
  }
  switch(iVar2) {
  case 0x500:
    lVar5 = 0xf;
    pcVar7 = "GL_INVALID_ENUM";
    break;
  case 0x501:
    lVar5 = 0x10;
    pcVar7 = "GL_INVALID_VALUE";
    break;
  case 0x502:
    lVar5 = 0x14;
    pcVar7 = "GL_INVALID_OPERATION";
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    goto LAB_003c627f;
  case 0x505:
    lVar5 = 0x10;
    pcVar7 = "GL_OUT_OF_MEMORY";
    break;
  case 0x506:
    lVar5 = 0x20;
    pcVar7 = "GL_INVALID_FRAMEBUFFER_OPERATION";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
LAB_003c627f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at line ",9);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
             ,0x70);
  std::endl<char,std::char_traits<char>>(poVar4);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Rectangle.cpp"
                ,0x24,"Outputs::Display::OpenGL::Rectangle::Rectangle(float, float, float, float)");
}

Assistant:

Rectangle::Rectangle(float x, float y, float width, float height):
	pixel_shader_(
		"#version 150\n"

		"in vec2 position;"

		"void main(void)"
		"{"
			"gl_Position = vec4(position, 0.0, 1.0);"
		"}",

		"#version 150\n"

		"uniform vec4 colour;"
		"out vec4 fragColour;"

		"void main(void)"
		"{"
			"fragColour = colour;"
		"}"
	){
	pixel_shader_.bind();

	test_gl(glGenVertexArrays, 1, &drawing_vertex_array_);
	test_gl(glGenBuffers, 1, &drawing_array_buffer_);

	test_gl(glBindVertexArray, drawing_vertex_array_);
	test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);

	GLint position_attribute = pixel_shader_.get_attrib_location("position");
	test_gl(glEnableVertexAttribArray, GLuint(position_attribute));

	test_gl(glVertexAttribPointer,
		(GLuint)position_attribute,
		2,
		GL_FLOAT,
		GL_FALSE,
		2 * sizeof(GLfloat),
		(void *)0);

	colour_uniform_ = pixel_shader_.get_uniform_location("colour");

	float buffer[4*2];

	// Store positions.
	buffer[0] = x;			buffer[1] = y;
	buffer[2] = x;			buffer[3] = y + height;
	buffer[4] = x + width;	buffer[5] = y;
	buffer[6] = x + width;	buffer[7] = y + height;

	// Upload buffer.
	test_gl(glBindBuffer, GL_ARRAY_BUFFER, drawing_array_buffer_);
	test_gl(glBufferData, GL_ARRAY_BUFFER, sizeof(buffer), buffer, GL_STATIC_DRAW);
}